

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

void __thiscall
helics::EndpointInfo::disconnectFederate(EndpointInfo *this,GlobalFederateId fedToDisconnect)

{
  bool bVar1;
  iterator __last;
  undefined4 in_ESI;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  in_RDI;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  removeIterator_1;
  EndpointInformation *targetInfo;
  iterator __end3;
  iterator __begin3;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range3;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  removeIterator;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
  *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  EndpointInformation *this_00;
  GlobalHandle *in_stack_ffffffffffffff38;
  anon_class_4_1_6f9e477c_for__M_pred __pred;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff58;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  EndpointInformation *local_58;
  EndpointInformation *local_50;
  EndpointInformation *local_38;
  undefined4 local_2c;
  EndpointInformation *local_28;
  EndpointInformation *local_20;
  EndpointInformation *local_18;
  undefined4 local_4;
  
  local_4 = in_ESI;
  bVar1 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
          empty((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *
                )in_RDI._M_current);
  __pred.fedToDisconnect.gid = SUB84((ulong)in_stack_ffffffffffffff38 >> 0x20,0);
  if (!bVar1) {
    local_20 = (EndpointInformation *)
               std::
               vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
               begin(in_stack_ffffffffffffff28);
    local_28 = (EndpointInformation *)
               std::
               vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
               end(in_stack_ffffffffffffff28);
    local_2c = local_4;
    local_18 = (EndpointInformation *)
               std::
               remove_if<__gnu_cxx::__normal_iterator<helics::EndpointInformation*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>,helics::EndpointInfo::disconnectFederate(helics::GlobalFederateId)::__0>
                         (in_stack_ffffffffffffff48,in_RDI,
                          (GlobalFederateId)(BaseType)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    local_38 = (EndpointInformation *)
               std::
               vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
               end(in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::
            operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                        *)in_stack_ffffffffffffff28);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff38 = (GlobalHandle *)&in_RDI._M_current[3].key.field_2;
      __gnu_cxx::
      __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
      ::__normal_iterator<helics::EndpointInformation*>
                ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff30,
                 (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff28);
      local_50 = (EndpointInformation *)
                 std::
                 vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
                 end(in_stack_ffffffffffffff28);
      __gnu_cxx::
      __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
      ::__normal_iterator<helics::EndpointInformation*>
                ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff30,
                 (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)in_stack_ffffffffffffff28);
      local_58 = (EndpointInformation *)
                 std::
                 vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
                 erase(in_stack_ffffffffffffff48._M_current,in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::clear((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)0x5c5e1a);
      local_60 = &in_RDI._M_current[3].key.field_2;
      local_68._M_current =
           (EndpointInformation *)
           std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
           begin(in_stack_ffffffffffffff28);
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::end
                (in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                               ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)in_stack_ffffffffffffff28), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
        ::operator*(&local_68);
        std::
        vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
        ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                  ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)in_RDI._M_current,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        __gnu_cxx::
        __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
        ::operator++(&local_68);
      }
    }
    __pred.fedToDisconnect.gid = SUB84((ulong)in_stack_ffffffffffffff38 >> 0x20,0);
  }
  bVar1 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
          empty((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *
                )in_RDI._M_current);
  if (!bVar1) {
    std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::begin
              (in_stack_ffffffffffffff28);
    std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::end
              (in_stack_ffffffffffffff28);
    std::
    remove_if<__gnu_cxx::__normal_iterator<helics::EndpointInformation*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>,helics::EndpointInfo::disconnectFederate(helics::GlobalFederateId)::__1>
              (in_stack_ffffffffffffff48,in_RDI,__pred);
    this_00 = in_RDI._M_current + 3;
    __gnu_cxx::
    __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
    ::__normal_iterator<helics::EndpointInformation*>
              ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)this_00,
               (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)in_stack_ffffffffffffff28);
    __last = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ::end(in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<helics::EndpointInformation_const*,std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>>
    ::__normal_iterator<helics::EndpointInformation*>
              ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)this_00,
               (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                *)in_stack_ffffffffffffff28);
    std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::erase
              ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *)
               in_stack_ffffffffffffff48._M_current,in_stack_ffffffffffffff58,
               (const_iterator)__last._M_current);
  }
  return;
}

Assistant:

void EndpointInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [fedToDisconnect](const auto& targetInfo) {
                                                 return targetInfo.id.fed_id == fedToDisconnect;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator = std::remove_if(sourceInformation.begin(),
                                             sourceInformation.end(),
                                             [fedToDisconnect](const auto& sinfo) {
                                                 return sinfo.id.fed_id == fedToDisconnect;
                                             });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}